

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

string * google::protobuf::ToLowercaseWithoutUnderscores
                   (string *__return_storage_ptr__,string *name)

{
  ulong uVar1;
  char *pcVar2;
  undefined4 local_20;
  int i;
  string *name_local;
  string *result;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  for (local_20 = 0; uVar1 = std::__cxx11::string::size(), (ulong)(long)local_20 < uVar1;
      local_20 = local_20 + 1) {
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)name);
    if (*pcVar2 != '_') {
      pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)name);
      if ((*pcVar2 < 'A') ||
         (pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)name), 'Z' < *pcVar2)) {
        std::__cxx11::string::operator[]((ulong)name);
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      else {
        std::__cxx11::string::operator[]((ulong)name);
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static string ToLowercaseWithoutUnderscores(const string& name) {
  string result;
  for (int i = 0; i < name.size(); ++i) {
    if (name[i] != '_') {
      if (name[i] >= 'A' && name[i] <= 'Z') {
        result.push_back(name[i] - 'A' + 'a');
      } else {
        result.push_back(name[i]);
      }
    }
  }
  return result;
}